

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

bool wasm::replaceChildWith(Expression *expr,Expression *with)

{
  Expression **ppEVar1;
  pointer ppPVar2;
  char cVar3;
  Index IVar4;
  pointer ppPVar5;
  Expression ***pppEVar6;
  Index index;
  Index IVar7;
  AbstractChildIterator<wasm::ChildIterator> local_90;
  FindAll<wasm::Pop> local_50;
  pointer local_38;
  
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_90,expr);
  index = 0;
  IVar7 = (int)((ulong)((long)local_90.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_90.children.flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          (int)local_90.children.usedFixed;
  if (IVar7 != 0) {
    do {
      IVar4 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_90,index);
      pppEVar6 = local_90.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar4 - 4);
      if (IVar4 < 4) {
        pppEVar6 = local_90.children.fixed._M_elems + IVar4;
      }
      ppEVar1 = *pppEVar6;
      cVar3 = wasm::Type::isSubType((Type)(with->type).id,(Type)((*ppEVar1)->type).id);
      if (cVar3 != '\0') {
        FindAll<wasm::Pop>::FindAll(&local_50,*ppEVar1);
        ppPVar2 = local_50.list.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppPVar5 = local_50.list.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_50.list.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          local_38 = local_50.list.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          operator_delete(local_50.list.
                          super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.list.
                                super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.list.
                                super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          ppPVar5 = local_38;
        }
        if (ppPVar2 == ppPVar5) {
          *ppEVar1 = with;
          index = 1;
          goto LAB_0015c7d9;
        }
      }
      index = index + 1;
    } while (IVar7 != index);
    index = 0;
  }
LAB_0015c7d9:
  if (local_90.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return SUB41(index,0);
}

Assistant:

static bool replaceChildWith(Expression* expr, Expression* with) {
  for (auto*& child : ChildIterator(expr)) {
    // To replace, we must have an appropriate type, and we cannot replace a
    // Pop under any circumstances.
    if (Type::isSubType(with->type, child->type) &&
        FindAll<Pop>(child).list.empty()) {
      child = with;
      return true;
    }
  }
  return false;
}